

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall t_ocaml_generator::generate_service(t_ocaml_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *this_00;
  ofstream_with_content_based_conditional_update *this_01;
  ostream *poVar1;
  int __oflag;
  int __oflag_00;
  int __fd;
  t_ocaml_generator *this_02;
  string *psVar2;
  string f_service_i_name;
  string f_service_name;
  undefined1 local_150 [32];
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_150,this);
  psVar2 = &(this->super_t_oop_generator).super_t_generator.service_name_;
  std::__cxx11::string::string((string *)&local_70,(string *)psVar2);
  t_generator::capitalize((string *)(local_150 + 0x20),(t_generator *)this,&local_70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_150 + 0x40),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_150 + 0x20));
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_150 + 0x40),".ml");
  std::__cxx11::string::~string((string *)(local_150 + 0x40));
  std::__cxx11::string::~string((string *)(local_150 + 0x20));
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_150);
  std::__cxx11::string::string
            ((string *)(local_150 + 0x40),local_50._M_dataplus._M_p,(allocator *)local_150);
  this_00 = &this->f_service_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_00,local_150 + 0x40,__oflag);
  std::__cxx11::string::~string((string *)(local_150 + 0x40));
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_150 + 0x20,this);
  std::__cxx11::string::string((string *)(local_150 + 0xa0),(string *)psVar2);
  t_generator::capitalize(&local_90,(t_generator *)this,(string *)(local_150 + 0xa0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_150 + 0x20),&local_90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_150 + 0x40),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                 ".mli");
  std::__cxx11::string::~string((string *)local_150);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)(local_150 + 0xa0));
  std::__cxx11::string::~string((string *)(local_150 + 0x20));
  std::__cxx11::string::string
            ((string *)local_150,local_110._M_dataplus._M_p,(allocator *)(local_150 + 0x20));
  this_01 = &this->f_service_i_;
  this_02 = (t_ocaml_generator *)local_150;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_01,(char *)this_02,__oflag_00);
  std::__cxx11::string::~string((string *)local_150);
  ocaml_autogen_comment_abi_cxx11_((string *)local_150,this_02);
  poVar1 = std::operator<<((ostream *)this_00,(string *)local_150);
  psVar2 = &::endl_abi_cxx11_;
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  ocaml_imports_abi_cxx11_((string *)(local_150 + 0x20),(t_ocaml_generator *)psVar2);
  poVar1 = std::operator<<(poVar1,(string *)(local_150 + 0x20));
  psVar2 = &::endl_abi_cxx11_;
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(local_150 + 0x20));
  std::__cxx11::string::~string((string *)local_150);
  ocaml_autogen_comment_abi_cxx11_((string *)local_150,(t_ocaml_generator *)psVar2);
  poVar1 = std::operator<<((ostream *)this_01,(string *)local_150);
  psVar2 = &::endl_abi_cxx11_;
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  ocaml_imports_abi_cxx11_((string *)(local_150 + 0x20),(t_ocaml_generator *)psVar2);
  poVar1 = std::operator<<(poVar1,(string *)(local_150 + 0x20));
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(local_150 + 0x20));
  std::__cxx11::string::~string((string *)local_150);
  poVar1 = std::operator<<((ostream *)this_00,"open ");
  psVar2 = &(this->super_t_oop_generator).super_t_generator.program_name_;
  std::__cxx11::string::string((string *)(local_150 + 0x80),(string *)psVar2);
  t_generator::capitalize((string *)local_150,(t_generator *)this,(string *)(local_150 + 0x80));
  poVar1 = std::operator<<(poVar1,(string *)local_150);
  poVar1 = std::operator<<(poVar1,"_types");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_150);
  std::__cxx11::string::~string((string *)(local_150 + 0x80));
  poVar1 = std::operator<<((ostream *)this_01,"open ");
  std::__cxx11::string::string((string *)(local_150 + 0x60),(string *)psVar2);
  t_generator::capitalize((string *)local_150,(t_generator *)this,(string *)(local_150 + 0x60));
  poVar1 = std::operator<<(poVar1,(string *)local_150);
  poVar1 = std::operator<<(poVar1,"_types");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_150);
  std::__cxx11::string::~string((string *)(local_150 + 0x60));
  generate_service_helpers(this,tservice);
  generate_service_interface(this,tservice);
  generate_service_client(this,tservice);
  generate_service_server(this,tservice);
  __fd = (int)tservice;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_00,__fd);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_01,__fd);
  std::__cxx11::string::~string((string *)(local_150 + 0x40));
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void t_ocaml_generator::generate_service(t_service* tservice) {
  string f_service_name = get_out_dir() + capitalize(service_name_) + ".ml";
  f_service_.open(f_service_name.c_str());
  string f_service_i_name = get_out_dir() + capitalize(service_name_) + ".mli";
  f_service_i_.open(f_service_i_name.c_str());

  f_service_ << ocaml_autogen_comment() << endl << ocaml_imports() << endl;
  f_service_i_ << ocaml_autogen_comment() << endl << ocaml_imports() << endl;

  /* if (tservice->get_extends() != nullptr) {
    f_service_ <<
      "open " << capitalize(tservice->get_extends()->get_name()) << endl;
    f_service_i_ <<
      "open " << capitalize(tservice->get_extends()->get_name()) << endl;
  }
  */
  f_service_ << "open " << capitalize(program_name_) << "_types" << endl << endl;

  f_service_i_ << "open " << capitalize(program_name_) << "_types" << endl << endl;

  // Generate the three main parts of the service
  generate_service_helpers(tservice);
  generate_service_interface(tservice);
  generate_service_client(tservice);
  generate_service_server(tservice);

  // Close service file
  f_service_.close();
  f_service_i_.close();
}